

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O1

void __thiscall
FGLRenderer::WriteSavePic(FGLRenderer *this,player_t *player,FILE *file,int width,int height)

{
  bool bVar1;
  DThinker *pDVar2;
  sector_t *viewsector;
  void *block;
  AActor *camera;
  FGLRenderer *pFVar3;
  GL_IRECT bounds;
  TThinkerIterator<ADynamicLight> it;
  GL_IRECT local_60;
  FILE *local_50;
  FThinkerIterator local_48;
  
  local_60.left = 0;
  local_60.top = 0;
  pFVar3 = this;
  local_60.width = width;
  local_60.height = height;
  local_50 = file;
  (*_ptrc_glFlush)();
  SetFixedColormap(pFVar3,player);
  pFVar3 = GLRenderer;
  gl_RenderState.mVertexBuffer = &this->mVBO->super_FVertexBuffer;
  GLRenderer->mVBO->mCurIndex = GLRenderer->mVBO->mIndex;
  if (gl.legacyMode == false) {
    FLightBuffer::Clear(pFVar3->mLights);
  }
  FThinkerIterator::FThinkerIterator(&local_48,ADynamicLight::RegistrationInfo.MyClass,0x40);
  pDVar2 = FThinkerIterator::Next(&local_48);
  GLRenderer->mLightCount = (uint)(pDVar2 != (DThinker *)0x0);
  camera = (AActor *)(&DAT_00a39408)[(long)consoleplayer * 0x54];
  if ((camera != (AActor *)0x0) &&
     (((camera->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (&DAT_00a39408)[(long)consoleplayer * 0x54] = 0;
    camera = (AActor *)0x0;
  }
  viewsector = RenderViewpoint(this,camera,&local_60,(float)FieldOfView.Degrees,1.6,1.6,true,false);
  (*_ptrc_glDisable)(0xb90);
  gl_RenderState.mColormapState = 0;
  gl_RenderState.mLightParms[3] = *(float *)(&DAT_00725918 + (ulong)(glset.lightmode == '\b') * 4);
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])(screen,0);
  bVar1 = FGLRenderBuffers::IsEnabled();
  if (!bVar1) {
    DrawBlend(this,viewsector);
  }
  CopyToBackbuffer(this,&local_60,false);
  (*_ptrc_glFlush)();
  block = M_Malloc_Dbg((long)(width * 3 * height),
                       "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/gl/scene/gl_scene.cpp"
                       ,0x3da);
  (*_ptrc_glReadPixels)(0,0,width,height,0x1907,0x1401,block);
  M_CreatePNG(local_50,(BYTE *)((long)((height + -1) * width * 3) + (long)block),(PalEntry *)0x0,
              SS_RGB,width,height,width * -3);
  M_Free(block);
  return;
}

Assistant:

void FGLRenderer::WriteSavePic (player_t *player, FILE *file, int width, int height)
{
	GL_IRECT bounds;

	bounds.left=0;
	bounds.top=0;
	bounds.width=width;
	bounds.height=height;
	glFlush();
	SetFixedColormap(player);
	gl_RenderState.SetVertexBuffer(mVBO);
	GLRenderer->mVBO->Reset();
	if (!gl.legacyMode) GLRenderer->mLights->Clear();

	// Check if there's some lights. If not some code can be skipped.
	TThinkerIterator<ADynamicLight> it(STAT_DLIGHT);
	GLRenderer->mLightCount = ((it.Next()) != NULL);

	sector_t *viewsector = RenderViewpoint(players[consoleplayer].camera, &bounds, 
								FieldOfView.Degrees, 1.6f, 1.6f, true, false);
	glDisable(GL_STENCIL_TEST);
	gl_RenderState.SetFixedColormap(CM_DEFAULT);
	gl_RenderState.SetSoftLightLevel(-1);
	screen->Begin2D(false);
	if (!FGLRenderBuffers::IsEnabled())
	{
		DrawBlend(viewsector);
	}
	CopyToBackbuffer(&bounds, false);
	glFlush();

	byte * scr = (byte *)M_Malloc(width * height * 3);
	glReadPixels(0,0,width, height,GL_RGB,GL_UNSIGNED_BYTE,scr);
	M_CreatePNG (file, scr + ((height-1) * width * 3), NULL, SS_RGB, width, height, -width*3);
	M_Free(scr);
}